

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mcts.cpp
# Opt level: O1

void __thiscall TestGame::do_move(TestGame *this,Move move)

{
  int iVar1;
  
  if (this->player_to_move == 2) {
    if (4 < move - 1U) {
      MCTS::assertion_failed
                ("move >= 1 && move <= 5",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/tests/test_mcts.cpp"
                 ,0x2e);
    }
    iVar1 = 1;
    if (move != 1) {
      iVar1 = this->X;
    }
  }
  else {
    if (this->player_to_move != 1) goto LAB_00148528;
    if (1 < move - 1U) {
      MCTS::assertion_failed
                ("move >= 1 && move <= 2",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/tests/test_mcts.cpp"
                 ,0x25);
    }
    iVar1 = 0;
    if (move != 1) goto LAB_00148528;
  }
  this->winner = iVar1;
LAB_00148528:
  this->player_to_move = 3 - this->player_to_move;
  return;
}

Assistant:

void do_move(Move move)
	{
		if (player_to_move == 1) {
			attest(move >= 1 && move <= 2);

			if (move == 1) {
				winner = 0;
			}
			else {
			}
		}
		else if (player_to_move == 2) {
			attest(move >= 1 && move <= 5);

			if (move == 1) {
				winner = 1;
			}
			else {
				winner = X;
			}
		}

		player_to_move = 3 - player_to_move;
	}